

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

QStringList * __thiscall
QDeviceDiscoveryUDev::scanConnectedDevices
          (QStringList *__return_storage_ptr__,QDeviceDiscoveryUDev *this)

{
  qsizetype *this_00;
  QString **debug;
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  QDebug *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QList<QString> local_80;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if (*(long *)(this + 0x18) != 0) {
    uVar4 = udev_enumerate_new();
    udev_enumerate_add_match_subsystem(uVar4,"input");
    udev_enumerate_add_match_subsystem(uVar4,"drm");
    uVar2 = *(uint *)(this + 0x10);
    if ((uVar2 & 1) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_MOUSE","1");
      uVar2 = *(uint *)(this + 0x10);
    }
    if ((uVar2 & 2) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHPAD","1");
      uVar2 = *(uint *)(this + 0x10);
    }
    if ((uVar2 & 4) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHSCREEN","1");
      uVar2 = *(uint *)(this + 0x10);
    }
    if ((uVar2 & 8) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEYBOARD","1");
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEY","1");
      uVar2 = *(uint *)(this + 0x10);
    }
    cVar1 = (char)uVar2;
    if ((uVar2 & 0x40) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TABLET","1");
      cVar1 = (char)*(undefined4 *)(this + 0x10);
    }
    if (cVar1 < '\0') {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_JOYSTICK","1");
    }
    iVar3 = udev_enumerate_scan_devices(uVar4);
    if (iVar3 == 0) {
      lVar5 = udev_enumerate_get_list_entry(uVar4);
      for (; lVar5 != 0; lVar5 = udev_list_entry_get_next(lVar5)) {
        uVar6 = udev_list_entry_get_name(lVar5);
        uVar6 = udev_device_new_from_syspath(*(undefined8 *)(this + 0x18),uVar6);
        local_58.size._0_4_ = 0xaaaaaaaa;
        local_58.size._4_4_ = 0xaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        local_80.d.size = udev_device_get_devnode(uVar6);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_68,(char **)&local_80.d.size);
        QVar10.m_data = (storage_type *)local_68.m_size;
        QVar10.m_size = (qsizetype)&local_58;
        QString::fromUtf8(QVar10);
        if (((byte)this[0x10] & 0xcf) != 0) {
          cVar1 = QString::startsWith((QLatin1String *)&local_58,0x10);
          if (cVar1 != '\0') {
            QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_58)
            ;
          }
        }
        if (((byte)this[0x10] & 0x10) != 0) {
          cVar1 = QString::startsWith((QLatin1String *)&local_58,0xd);
          if (cVar1 != '\0') {
            if (((byte)this[0x10] & 0x20) == 0) {
LAB_00113431:
              QList<QString>::emplaceBack<QString_const&>
                        (__return_storage_ptr__,(QString *)&local_58);
            }
            else {
              lVar7 = udev_device_get_parent_with_subsystem_devtype(uVar6,"pci",0);
              if (lVar7 != 0) {
                pcVar8 = (char *)udev_device_get_sysattr_value(lVar7,"boot_vga");
                iVar3 = qstrcmp(pcVar8,"1");
                if (iVar3 == 0) goto LAB_00113431;
              }
            }
          }
        }
        udev_device_unref(uVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      udev_enumerate_unref(uVar4);
      lcDD();
      if (((byte)lcDD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_58.d._0_4_ = 2;
        local_58._4_8_ = (undefined1 *)0x0;
        local_58.ptr._4_4_ = 0;
        local_58.size._0_4_ = 0;
        local_58.size._4_4_ = 0;
        local_40 = lcDD::category.name;
        this_00 = &local_80.d.size;
        QMessageLogger::debug();
        pQVar9 = QDebug::operator<<((QDebug *)this_00,"Found matching devices");
        local_80.d.d = (Data *)pQVar9->stream;
        *(int *)((long)local_80.d.d + 0x28) = *(int *)((long)local_80.d.d + 0x28) + 1;
        debug = &local_80.d.ptr;
        operator<<((QDebug)debug,&local_80);
        QDebug::~QDebug((QDebug *)debug);
        QDebug::~QDebug((QDebug *)&local_80);
        QDebug::~QDebug((QDebug *)this_00);
      }
    }
    else {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58._4_8_ = (undefined1 *)0x0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_40 = "default";
      QMessageLogger::warning((char *)&local_58,"Failed to scan devices");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDeviceDiscoveryUDev::scanConnectedDevices()
{
    QStringList devices;

    if (!m_udev)
        return devices;

    udev_enumerate *ue = udev_enumerate_new(m_udev);
    udev_enumerate_add_match_subsystem(ue, "input");
    udev_enumerate_add_match_subsystem(ue, "drm");

    if (m_types & Device_Mouse)
        udev_enumerate_add_match_property(ue, "ID_INPUT_MOUSE", "1");
    if (m_types & Device_Touchpad)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHPAD", "1");
    if (m_types & Device_Touchscreen)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHSCREEN", "1");
    if (m_types & Device_Keyboard) {
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEYBOARD", "1");
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEY", "1");
    }
    if (m_types & Device_Tablet)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TABLET", "1");
    if (m_types & Device_Joystick)
        udev_enumerate_add_match_property(ue, "ID_INPUT_JOYSTICK", "1");

    if (udev_enumerate_scan_devices(ue) != 0) {
        qWarning("Failed to scan devices");
        return devices;
    }

    udev_list_entry *entry;
    udev_list_entry_foreach (entry, udev_enumerate_get_list_entry(ue)) {
        const char *syspath = udev_list_entry_get_name(entry);
        udev_device *udevice = udev_device_new_from_syspath(m_udev, syspath);
        QString candidate = QString::fromUtf8(udev_device_get_devnode(udevice));
        if ((m_types & Device_InputMask) && candidate.startsWith(QT_EVDEV_DEVICE ""_L1))
            devices << candidate;
        if ((m_types & Device_VideoMask) && candidate.startsWith(QT_DRM_DEVICE ""_L1)) {
            if (m_types & Device_DRM_PrimaryGPU) {
                udev_device *pci = udev_device_get_parent_with_subsystem_devtype(udevice, "pci", 0);
                if (pci) {
                    if (qstrcmp(udev_device_get_sysattr_value(pci, "boot_vga"), "1") == 0)
                        devices << candidate;
                }
            } else
                devices << candidate;
        }

        udev_device_unref(udevice);
    }
    udev_enumerate_unref(ue);

    qCDebug(lcDD) << "Found matching devices" << devices;

    return devices;
}